

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

btScalar __thiscall btRaycastVehicle::rayCast(btRaycastVehicle *this,btWheelInfo *wheel)

{
  btRigidBody *pbVar1;
  btWheelInfo *in_RSI;
  btRaycastVehicle *in_RDI;
  btScalar bVar2;
  float fVar3;
  btVector3 bVar4;
  btScalar inv;
  btScalar projVel;
  btVector3 relpos;
  btVector3 chassis_velocity_at_contactPoint;
  btScalar denominator;
  btScalar maxSuspensionLength;
  btScalar minSuspensionLength;
  btScalar hitDistance;
  void *object;
  btVehicleRaycasterResult rayResults;
  btScalar param;
  btVector3 *target;
  btVector3 *source;
  btVector3 rayvector;
  btScalar raylen;
  btScalar depth;
  btVehicleRaycasterResult *in_stack_ffffffffffffff20;
  btRigidBody *in_stack_ffffffffffffff30;
  undefined8 local_c8;
  btScalar local_b8 [2];
  btScalar local_b0 [6];
  btVector3 local_98;
  btScalar local_88;
  float local_84;
  float local_80;
  float local_7c;
  long local_78;
  undefined7 local_70;
  undefined1 in_stack_ffffffffffffff97;
  btWheelInfo *in_stack_ffffffffffffff98;
  btRaycastVehicle *in_stack_ffffffffffffffa0;
  undefined8 local_58;
  float local_50;
  undefined8 local_40;
  undefined8 local_38;
  float local_14;
  
  updateWheelTransformsWS
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,(bool)in_stack_ffffffffffffff97);
  local_14 = -1.0;
  bVar2 = btWheelInfo::getSuspensionRestLength(in_RSI);
  fVar3 = bVar2 + in_RSI->m_wheelsRadius;
  ::operator*((btVector3 *)in_stack_ffffffffffffff30,(btScalar *)in_RDI);
  bVar4 = operator+((btVector3 *)in_stack_ffffffffffffff30,(btVector3 *)in_RDI);
  local_40 = bVar4.m_floats._0_8_;
  *(undefined8 *)(in_RSI->m_raycastInfo).m_contactPointWS.m_floats = local_40;
  local_38 = bVar4.m_floats._8_8_;
  *(undefined8 *)((in_RSI->m_raycastInfo).m_contactPointWS.m_floats + 2) = local_38;
  btVehicleRaycaster::btVehicleRaycasterResult::btVehicleRaycasterResult(in_stack_ffffffffffffff20);
  local_78 = (**(code **)(*(long *)in_RDI->m_vehicleRaycaster + 0x10))
                       (in_RDI->m_vehicleRaycaster,&(in_RSI->m_raycastInfo).m_hardPointWS,
                        &(in_RSI->m_raycastInfo).m_contactPointWS,&local_70);
  (in_RSI->m_raycastInfo).m_groundObject = (void *)0x0;
  if (local_78 == 0) {
    bVar2 = btWheelInfo::getSuspensionRestLength(in_RSI);
    (in_RSI->m_raycastInfo).m_suspensionLength = bVar2;
    in_RSI->m_suspensionRelativeVelocity = 0.0;
    bVar4 = operator-(&in_stack_ffffffffffffff20->m_hitPointInWorld);
    *(long *)(in_RSI->m_raycastInfo).m_contactNormalWS.m_floats = bVar4.m_floats._0_8_;
    local_c8 = bVar4.m_floats._8_8_;
    *(undefined8 *)((in_RSI->m_raycastInfo).m_contactNormalWS.m_floats + 2) = local_c8;
    in_RSI->m_clippedInvContactDotSuspension = 1.0;
  }
  else {
    local_14 = fVar3 * local_50;
    *(btRaycastVehicle **)(in_RSI->m_raycastInfo).m_contactNormalWS.m_floats =
         in_stack_ffffffffffffffa0;
    *(undefined8 *)((in_RSI->m_raycastInfo).m_contactNormalWS.m_floats + 2) = local_58;
    (in_RSI->m_raycastInfo).m_isInContact = true;
    pbVar1 = btActionInterface::getFixedBody();
    (in_RSI->m_raycastInfo).m_groundObject = pbVar1;
    local_7c = local_50 * fVar3;
    (in_RSI->m_raycastInfo).m_suspensionLength = local_7c - in_RSI->m_wheelsRadius;
    bVar2 = btWheelInfo::getSuspensionRestLength(in_RSI);
    local_80 = -in_RSI->m_maxSuspensionTravelCm * 0.01 + bVar2;
    bVar2 = btWheelInfo::getSuspensionRestLength(in_RSI);
    local_84 = in_RSI->m_maxSuspensionTravelCm * 0.01 + bVar2;
    if ((in_RSI->m_raycastInfo).m_suspensionLength < local_80) {
      (in_RSI->m_raycastInfo).m_suspensionLength = local_80;
    }
    if (local_84 < (in_RSI->m_raycastInfo).m_suspensionLength) {
      (in_RSI->m_raycastInfo).m_suspensionLength = local_84;
    }
    *(ulong *)(in_RSI->m_raycastInfo).m_contactPointWS.m_floats =
         CONCAT17(in_stack_ffffffffffffff97,local_70);
    *(btWheelInfo **)((in_RSI->m_raycastInfo).m_contactPointWS.m_floats + 2) =
         in_stack_ffffffffffffff98;
    local_88 = btVector3::dot((btVector3 *)in_RSI,&(in_RSI->m_raycastInfo).m_wheelDirectionWS);
    btVector3::btVector3(&local_98);
    getRigidBody(in_RDI);
    btRigidBody::getCenterOfMassPosition((btRigidBody *)0x23444a);
    operator-((btVector3 *)in_stack_ffffffffffffff30,(btVector3 *)in_RDI);
    getRigidBody(in_RDI);
    bVar4 = btRigidBody::getVelocityInLocalPoint(in_stack_ffffffffffffff30,(btVector3 *)in_RDI);
    local_b8 = bVar4.m_floats._0_8_;
    local_98.m_floats[0] = local_b8[0];
    local_98.m_floats[1] = local_b8[1];
    local_b0._0_8_ = bVar4.m_floats._8_8_;
    local_98.m_floats[2] = local_b0[0];
    local_98.m_floats[3] = local_b0[1];
    bVar2 = btVector3::dot((btVector3 *)in_RSI,&local_98);
    if (local_88 < -0.1) {
      in_RSI->m_suspensionRelativeVelocity = bVar2 * (-1.0 / local_88);
      in_RSI->m_clippedInvContactDotSuspension = -1.0 / local_88;
    }
    else {
      in_RSI->m_suspensionRelativeVelocity = 0.0;
      in_RSI->m_clippedInvContactDotSuspension = 10.0;
    }
  }
  return local_14;
}

Assistant:

btScalar btRaycastVehicle::rayCast(btWheelInfo& wheel)
{
	updateWheelTransformsWS( wheel,false);

	
	btScalar depth = -1;
	
	btScalar raylen = wheel.getSuspensionRestLength()+wheel.m_wheelsRadius;

	btVector3 rayvector = wheel.m_raycastInfo.m_wheelDirectionWS * (raylen);
	const btVector3& source = wheel.m_raycastInfo.m_hardPointWS;
	wheel.m_raycastInfo.m_contactPointWS = source + rayvector;
	const btVector3& target = wheel.m_raycastInfo.m_contactPointWS;

	btScalar param = btScalar(0.);
	
	btVehicleRaycaster::btVehicleRaycasterResult	rayResults;

	btAssert(m_vehicleRaycaster);

	void* object = m_vehicleRaycaster->castRay(source,target,rayResults);

	wheel.m_raycastInfo.m_groundObject = 0;

	if (object)
	{
		param = rayResults.m_distFraction;
		depth = raylen * rayResults.m_distFraction;
		wheel.m_raycastInfo.m_contactNormalWS  = rayResults.m_hitNormalInWorld;
		wheel.m_raycastInfo.m_isInContact = true;
		
		wheel.m_raycastInfo.m_groundObject = &getFixedBody();///@todo for driving on dynamic/movable objects!;
		//wheel.m_raycastInfo.m_groundObject = object;


		btScalar hitDistance = param*raylen;
		wheel.m_raycastInfo.m_suspensionLength = hitDistance - wheel.m_wheelsRadius;
		//clamp on max suspension travel

		btScalar  minSuspensionLength = wheel.getSuspensionRestLength() - wheel.m_maxSuspensionTravelCm*btScalar(0.01);
		btScalar maxSuspensionLength = wheel.getSuspensionRestLength()+ wheel.m_maxSuspensionTravelCm*btScalar(0.01);
		if (wheel.m_raycastInfo.m_suspensionLength < minSuspensionLength)
		{
			wheel.m_raycastInfo.m_suspensionLength = minSuspensionLength;
		}
		if (wheel.m_raycastInfo.m_suspensionLength > maxSuspensionLength)
		{
			wheel.m_raycastInfo.m_suspensionLength = maxSuspensionLength;
		}

		wheel.m_raycastInfo.m_contactPointWS = rayResults.m_hitPointInWorld;

		btScalar denominator= wheel.m_raycastInfo.m_contactNormalWS.dot( wheel.m_raycastInfo.m_wheelDirectionWS );

		btVector3 chassis_velocity_at_contactPoint;
		btVector3 relpos = wheel.m_raycastInfo.m_contactPointWS-getRigidBody()->getCenterOfMassPosition();

		chassis_velocity_at_contactPoint = getRigidBody()->getVelocityInLocalPoint(relpos);

		btScalar projVel = wheel.m_raycastInfo.m_contactNormalWS.dot( chassis_velocity_at_contactPoint );

		if ( denominator >= btScalar(-0.1))
		{
			wheel.m_suspensionRelativeVelocity = btScalar(0.0);
			wheel.m_clippedInvContactDotSuspension = btScalar(1.0) / btScalar(0.1);
		}
		else
		{
			btScalar inv = btScalar(-1.) / denominator;
			wheel.m_suspensionRelativeVelocity = projVel * inv;
			wheel.m_clippedInvContactDotSuspension = inv;
		}
			
	} else
	{
		//put wheel info as in rest position
		wheel.m_raycastInfo.m_suspensionLength = wheel.getSuspensionRestLength();
		wheel.m_suspensionRelativeVelocity = btScalar(0.0);
		wheel.m_raycastInfo.m_contactNormalWS = - wheel.m_raycastInfo.m_wheelDirectionWS;
		wheel.m_clippedInvContactDotSuspension = btScalar(1.0);
	}

	return depth;
}